

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

void uv_sem_destroy(uv_sem_t *sem)

{
  uv_sem_t *sem_local;
  
  if (platform_needs_custom_semaphore == 0) {
    uv__sem_destroy(sem);
  }
  else {
    uv__custom_sem_destroy(sem);
  }
  return;
}

Assistant:

void uv_sem_destroy(uv_sem_t* sem) {
  if (platform_needs_custom_semaphore)
    uv__custom_sem_destroy(sem);
  else
    uv__sem_destroy(sem);
}